

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::Array<unsigned_char>_>::clear(ArrayBuilder<kj::Array<unsigned_char>_> *this)

{
  uchar *puVar1;
  size_t sVar2;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar3;
  
  pRVar3 = this->pos;
  if (this->ptr < pRVar3) {
    do {
      this->pos = pRVar3 + -1;
      puVar1 = pRVar3[-1].ptr;
      if (puVar1 != (uchar *)0x0) {
        sVar2 = pRVar3[-1].size_;
        pRVar3[-1].ptr = (uchar *)0x0;
        pRVar3[-1].size_ = 0;
        (**(pRVar3[-1].disposer)->_vptr_ArrayDisposer)(pRVar3[-1].disposer,puVar1,1,sVar2,sVar2,0);
      }
      pRVar3 = this->pos;
    } while (this->ptr < pRVar3);
  }
  return;
}

Assistant:

void clear() {
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(ptr);
    } else {
      while (pos > ptr) {
        kj::dtor(*--pos);
      }
    }
  }